

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaSweeper.c
# Opt level: O2

Vec_Int_t * Gia_ManGetCex(Gia_Man_t *pGia,Vec_Int_t *vId2Lit,sat_solver *pSat,Vec_Int_t *vCex)

{
  int iVar1;
  uint Lit;
  uint uVar2;
  Gia_Obj_t *pObj;
  int v;
  
  vCex->nSize = 0;
  v = 0;
  do {
    if (pGia->vCis->nSize - pGia->nRegs <= v) {
      return vCex;
    }
    pObj = Gia_ManCi(pGia,v);
    if (pObj == (Gia_Obj_t *)0x0) {
      return vCex;
    }
    iVar1 = Gia_ObjId(pGia,pObj);
    uVar2 = 2;
    if (iVar1 < vId2Lit->nSize) {
      iVar1 = Gia_ObjId(pGia,pObj);
      Lit = Vec_IntEntry(vId2Lit,iVar1);
      if (Lit != 0) {
        if ((int)Lit < 1) {
          __assert_fail("LitSat > 0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaSweeper.c"
                        ,0x303,
                        "Vec_Int_t *Gia_ManGetCex(Gia_Man_t *, Vec_Int_t *, sat_solver *, Vec_Int_t *)"
                       );
        }
        uVar2 = Abc_Lit2Var(Lit);
        if (pSat->size <= (int)uVar2) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/sat/bsat/satSolver.h"
                        ,0xd0,"int sat_solver_var_value(sat_solver *, int)");
        }
        uVar2 = Lit & 1 ^ (uint)(pSat->model[uVar2] == 1);
      }
    }
    Vec_IntPush(vCex,uVar2);
    v = v + 1;
  } while( true );
}

Assistant:

static Vec_Int_t * Gia_ManGetCex( Gia_Man_t * pGia, Vec_Int_t * vId2Lit, sat_solver * pSat, Vec_Int_t * vCex )
{
    Gia_Obj_t * pObj;
    int i, LitSat, Value;
    Vec_IntClear( vCex );
    Gia_ManForEachPi( pGia, pObj, i )
    {
        if ( Gia_ObjId(pGia, pObj) >= Vec_IntSize(vId2Lit) )
        {
            Vec_IntPush( vCex, 2 );
            continue;
        }
        LitSat = Vec_IntEntry( vId2Lit, Gia_ObjId(pGia, pObj) );
        if ( LitSat == 0 )
        {
            Vec_IntPush( vCex, 2 );
            continue;
        }
        assert( LitSat > 0 );
        Value = sat_solver_var_value(pSat, Abc_Lit2Var(LitSat)) ^ Abc_LitIsCompl(LitSat);
        Vec_IntPush( vCex, Value );
    }
    return vCex;
}